

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

bool anon_unknown.dwarf_5db41::parse_internal
               (int argc,char **argv,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *unparsed_args)

{
  pointer haystack;
  bool bVar1;
  ostream *poVar2;
  iterator iVar3;
  long lVar4;
  _Rb_tree_node_base *p_Var5;
  Logger *pLVar6;
  bool bVar7;
  _Base_ptr p_Var8;
  _Rb_tree_node_base *p_Var9;
  ulong uVar10;
  allocator local_d9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parsed_arg;
  string config_filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  matches;
  string program_name;
  
  (anonymous_namespace)::geo_argc = argc;
  (anonymous_namespace)::geo_argv = argv;
  if (argc < 1) {
    std::__cxx11::string::string((string *)&program_name,"argc >= 1",(allocator *)&parsed_arg);
    std::__cxx11::string::string
              ((string *)&config_filename,
               "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
               ,(allocator *)&matches);
    GEO::geo_assertion_failed(&program_name,&config_filename,0x966);
  }
  std::__cxx11::string::string((string *)&parsed_arg,*argv,(allocator *)&matches);
  GEO::FileSystem::base_name(&config_filename,(string *)&parsed_arg,true);
  GEO::String::to_uppercase(&program_name,&config_filename);
  std::__cxx11::string::~string((string *)&config_filename);
  std::__cxx11::string::~string((string *)&parsed_arg);
  if ((anonymous_namespace)::parse_config_file(int,char**)::init == '\0') {
    (anonymous_namespace)::parse_config_file(int,char**)::init = '\x01';
    std::__cxx11::string::string((string *)&config_filename,"config",(allocator *)&parsed_arg);
    poVar2 = GEO::Logger::out(&config_filename);
    poVar2 = std::operator<<(poVar2,"Configuration file name:");
    poVar2 = std::operator<<(poVar2,(string *)(anonymous_namespace)::config_file_name_abi_cxx11_);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&config_filename);
    std::__cxx11::string::string((string *)&config_filename,"config",(allocator *)&matches);
    poVar2 = GEO::Logger::out(&config_filename);
    poVar2 = std::operator<<(poVar2,"Home directory:");
    GEO::FileSystem::home_directory_abi_cxx11_();
    poVar2 = std::operator<<(poVar2,(string *)&parsed_arg);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&parsed_arg);
    std::__cxx11::string::~string((string *)&config_filename);
    GEO::FileSystem::home_directory_abi_cxx11_();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parsed_arg,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&matches,"/"
                  );
    std::operator+(&config_filename,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parsed_arg,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (anonymous_namespace)::config_file_name_abi_cxx11_);
    std::__cxx11::string::~string((string *)&parsed_arg);
    std::__cxx11::string::~string((string *)&matches);
    parse_config_file(&config_filename,&program_name);
    std::__cxx11::string::~string((string *)&config_filename);
  }
  std::__cxx11::string::~string((string *)&program_name);
  std::__cxx11::string::assign((anonymous_namespace)::desc_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(unparsed_args);
  bVar7 = true;
  uVar10 = 1;
  do {
    if ((uint)argc <= uVar10) {
      return bVar7;
    }
    parsed_arg.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    parsed_arg.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    parsed_arg.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&program_name,argv[uVar10],(allocator *)&config_filename)
    ;
    GEO::String::split_string(&program_name,'=',&parsed_arg,true);
    std::__cxx11::string::~string((string *)&program_name);
    haystack = parsed_arg.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((long)parsed_arg.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)parsed_arg.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x40) {
      std::__cxx11::string::string((string *)&program_name,"dbg:",(allocator *)&config_filename);
      bVar1 = GEO::String::string_starts_with(haystack,&program_name);
      if (bVar1) {
        std::__cxx11::string::~string((string *)&program_name);
      }
      else {
        iVar3 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
                ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
                        *)((anonymous_namespace)::desc_ + 0x20),
                       parsed_arg.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
        p_Var8 = (_Base_ptr)((anonymous_namespace)::desc_ + 0x28);
        std::__cxx11::string::~string((string *)&program_name);
        if (iVar3._M_node == p_Var8) {
          matches.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          matches.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          matches.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          p_Var9 = (_Rb_tree_node_base *)((anonymous_namespace)::desc_ + 0x28);
          for (p_Var5 = *(_Rb_tree_node_base **)((anonymous_namespace)::desc_ + 0x38);
              p_Var5 != p_Var9; p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
            lVar4 = std::__cxx11::string::find
                              ((string *)(p_Var5 + 1),
                               (ulong)parsed_arg.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
            if (lVar4 != -1) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&matches,(value_type *)(p_Var5 + 1));
            }
          }
          if ((long)matches.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)matches.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x20) {
            bVar1 = GEO::CmdLine::set_arg
                              (matches.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               parsed_arg.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 1);
            bVar7 = (bool)(bVar7 & bVar1);
          }
          else {
            if ((ulong)((long)matches.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)matches.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
              pLVar6 = GEO::Logger::instance();
              pLVar6->quiet_ = false;
              std::__cxx11::string::string
                        ((string *)&program_name,"CmdLine",(allocator *)&config_filename);
              poVar2 = GEO::Logger::err(&program_name);
              poVar2 = std::operator<<(poVar2,"Invalid argument: ");
              poVar2 = std::operator<<(poVar2,(string *)
                                              parsed_arg.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
              std::endl<char,std::char_traits<char>>(poVar2);
            }
            else {
              pLVar6 = GEO::Logger::instance();
              pLVar6->quiet_ = false;
              std::__cxx11::string::string((string *)&program_name,"CmdLine",&local_d9);
              poVar2 = GEO::Logger::err(&program_name);
              poVar2 = std::operator<<(poVar2,"Argument is ambiguous: ");
              poVar2 = std::operator<<(poVar2,argv[uVar10]);
              poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
              poVar2 = std::operator<<(poVar2,"Possible matches: ");
              GEO::String::join_strings(&config_filename,&matches,' ');
              poVar2 = std::operator<<(poVar2,(string *)&config_filename);
              std::endl<char,std::char_traits<char>>(poVar2);
              std::__cxx11::string::~string((string *)&config_filename);
            }
            std::__cxx11::string::~string((string *)&program_name);
            bVar7 = false;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&matches);
          goto LAB_0013f4ed;
        }
      }
      bVar1 = GEO::CmdLine::set_arg
                        (parsed_arg.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         parsed_arg.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1);
      bVar7 = (bool)(bVar7 & bVar1);
    }
    else {
      std::__cxx11::string::string
                ((string *)&program_name,argv[uVar10],(allocator *)&config_filename);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)unparsed_args,
                 &program_name);
      std::__cxx11::string::~string((string *)&program_name);
    }
LAB_0013f4ed:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&parsed_arg);
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

bool parse_internal(
        int argc, char** argv, std::vector<std::string>& unparsed_args
    ) {
	geo_argc = argc;
	geo_argv = argv;
	
	parse_config_file(argc, argv);
	
        bool ok = true;
        desc_->argv0 = argv[0];
        unparsed_args.clear();

        for(int i = 1; i < argc; i++) {
            std::vector<std::string> parsed_arg;
            String::split_string(argv[i], '=', parsed_arg);
            if(parsed_arg.size() != 2) {
                unparsed_args.push_back(argv[i]);
            } else {
                if(
                    String::string_starts_with(parsed_arg[0], "dbg:") ||
                    desc_->args.find(parsed_arg[0]) != desc_->args.end()
                ) {
                    if(!set_arg(parsed_arg[0], parsed_arg[1])) {
                        ok = false;
                    }
                } else {

                    std::vector<std::string> matches;
                    for( auto& it : desc_->args) {
                        if(arg_matches(parsed_arg[0], it.first)) {
                            matches.push_back(it.first);
                        }
                    }

                    if(matches.size() == 1) {
                        if(!set_arg(matches[0], parsed_arg[1])) {
                            ok = false;
                        }
                    } else if(matches.size() >= 2) {
                        ok = false;
                        Logger::instance()->set_quiet(false);
                        Logger::err("CmdLine")
                            << "Argument is ambiguous: " << argv[i]
                            << std::endl
                            << "Possible matches: "
                            << String::join_strings(matches, ' ')
                            << std::endl;
                    } else {
                        ok = false;
                        Logger::instance()->set_quiet(false);
                        Logger::err("CmdLine")
                            << "Invalid argument: " << parsed_arg[0]
                            << std::endl;
                    }
                }
            }
        }
        return ok;
    }